

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

double exp(double __x)

{
  size_type sVar1;
  pointer in_RSI;
  vector<Blade,_std::allocator<Blade>_> *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  vector<Blade,_std::allocator<Blade>_> local_148;
  vector<Blade,_std::allocator<Blade>_> local_130;
  Clifford local_118;
  vector<Blade,_std::allocator<Blade>_> local_100;
  vector<Blade,_std::allocator<Blade>_> local_e8;
  Clifford local_d0;
  Clifford local_b8;
  float local_9c;
  undefined1 local_98 [4];
  float n;
  vector<Blade,_std::allocator<Blade>_> local_80;
  Clifford local_68;
  Blade local_3c;
  undefined1 local_31;
  undefined1 local_30 [8];
  Clifford tP;
  Clifford *P_local;
  Clifford *R;
  
  tP.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_RSI;
  std::vector<Blade,_std::allocator<Blade>_>::vector
            ((vector<Blade,_std::allocator<Blade>_> *)local_30,
             (vector<Blade,_std::allocator<Blade>_> *)in_RSI);
  local_31 = 0;
  std::vector<Blade,_std::allocator<Blade>_>::vector(in_RDI);
  Blade::Blade(&local_3c,0,1.0);
  std::vector<Blade,_std::allocator<Blade>_>::push_back(in_RDI,&local_3c);
  Blade::~Blade(&local_3c);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_80,in_RDI);
  std::vector<Blade,_std::allocator<Blade>_>::vector
            ((vector<Blade,_std::allocator<Blade>_> *)local_98,
             (vector<Blade,_std::allocator<Blade>_> *)
             tP.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  operator+(&local_68,&local_80,(Clifford *)local_98);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(in_RDI,&local_68);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_68);
  std::vector<Blade,_std::allocator<Blade>_>::~vector
            ((vector<Blade,_std::allocator<Blade>_> *)local_98);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_80);
  for (local_9c = 2.0; local_9c <= 6.0; local_9c = local_9c + 1.0) {
    std::vector<Blade,_std::allocator<Blade>_>::vector
              (&local_e8,
               (vector<Blade,_std::allocator<Blade>_> *)
               tP.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage);
    std::vector<Blade,_std::allocator<Blade>_>::vector
              (&local_100,(vector<Blade,_std::allocator<Blade>_> *)local_30);
    operator*(&local_d0,&local_e8,&local_100);
    operator/(&local_b8,&local_d0,local_9c);
    std::vector<Blade,_std::allocator<Blade>_>::operator=
              ((vector<Blade,_std::allocator<Blade>_> *)local_30,&local_b8);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_b8);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d0);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_100);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_e8);
    sVar1 = std::vector<Blade,_std::allocator<Blade>_>::size
                      ((vector<Blade,_std::allocator<Blade>_> *)local_30);
    if (sVar1 == 0) {
      local_9c = 6.0;
    }
    else {
      std::vector<Blade,_std::allocator<Blade>_>::vector(&local_130,in_RDI);
      std::vector<Blade,_std::allocator<Blade>_>::vector
                (&local_148,(vector<Blade,_std::allocator<Blade>_> *)local_30);
      operator+(&local_118,&local_130,&local_148);
      std::vector<Blade,_std::allocator<Blade>_>::operator=(in_RDI,&local_118);
      std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_118);
      std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_148);
      std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_130);
    }
  }
  local_31 = 1;
  std::vector<Blade,_std::allocator<Blade>_>::~vector
            ((vector<Blade,_std::allocator<Blade>_> *)local_30);
  return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
}

Assistant:

Clifford exp(Clifford& P)
{
  Clifford tP=P,R;
  R.push_back(Blade(0,1.0));
  R=R+P;  
  for(float n=2;n<=6;n++)
  {	
	tP = P * tP/n;
	if(tP.size())R=R+tP;
	else{n=6;}
  }
  return R;
}